

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printContinue(JSPrinter *this,Ref node)

{
  size_t sVar1;
  char cVar2;
  Ref *this_00;
  undefined8 *puVar3;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"continue");
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_20);
  cVar2 = cashew::Ref::operator!(this_00);
  if (cVar2 == '\0') {
    maybeSpace(this,' ');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = ' ';
    puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
    if (*(int *)*puVar3 != 0) {
      __assert_fail("isString()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                    ,0xeb,"const char *cashew::Value::getCString()");
    }
    emit(this,*(char **)((int *)*puVar3 + 4));
  }
  return;
}

Assistant:

void printContinue(Ref node) {
    emit("continue");
    if (!!node[1]) {
      emit(' ');
      emit(node[1]->getCString());
    }
  }